

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O1

void __thiscall
QtPromisePrivate::PromiseDataBase<bool,_void_(const_bool_&)>::addCatcher
          (PromiseDataBase<bool,_void_(const_bool_&)> *this,
          function<void_(const_QtPromisePrivate::PromiseError_&)> *catcher)

{
  _Manager_type p_Var1;
  QWriteLocker lock;
  pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> local_50;
  
  QReadWriteLock::lockForWrite();
  local_50.first.wp.value = (QObject *)QThread::currentThread();
  if (local_50.first.wp.value == (QObject *)0x0) {
    local_50.first.wp.d = (Data *)0x0;
  }
  else {
    local_50.first.wp.d =
         (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(local_50.first.wp.value);
  }
  local_50.second.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_50.second.super__Function_base._M_functor._8_8_ = 0;
  local_50.second.super__Function_base._M_manager = (_Manager_type)0x0;
  local_50.second._M_invoker = catcher->_M_invoker;
  p_Var1 = (catcher->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_50.second.super__Function_base._M_functor._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(catcher->super__Function_base)._M_functor;
    local_50.second.super__Function_base._M_functor._8_8_ =
         *(undefined8 *)((long)&(catcher->super__Function_base)._M_functor + 8);
    (catcher->super__Function_base)._M_manager = (_Manager_type)0x0;
    catcher->_M_invoker = (_Invoker_type)0x0;
    local_50.second.super__Function_base._M_manager = p_Var1;
  }
  QtPrivate::
  QGenericArrayOps<std::pair<QPointer<QThread>,std::function<void(QtPromisePrivate::PromiseError_const&)>>>
  ::emplace<std::pair<QPointer<QThread>,std::function<void(QtPromisePrivate::PromiseError_const&)>>>
            ((QGenericArrayOps<std::pair<QPointer<QThread>,std::function<void(QtPromisePrivate::PromiseError_const&)>>>
              *)&this->m_catchers,(this->m_catchers).d.size,&local_50);
  if (local_50.second.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_50.second.super__Function_base._M_manager)
              ((_Any_data *)&local_50.second,(_Any_data *)&local_50.second,__destroy_functor);
  }
  if (local_50.first.wp.d != (Data *)0x0) {
    LOCK();
    ((local_50.first.wp.d)->weakref)._q_value.super___atomic_base<int>._M_i =
         ((local_50.first.wp.d)->weakref)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((local_50.first.wp.d)->weakref)._q_value.super___atomic_base<int>._M_i == 0) &&
       (local_50.first.wp.d != (Data *)0x0)) {
      operator_delete(local_50.first.wp.d);
    }
  }
  QReadWriteLock::unlock();
  return;
}

Assistant:

void addCatcher(std::function<void(const PromiseError&)> catcher)
    {
        QWriteLocker lock{&m_lock};
        m_catchers.append({QThread::currentThread(), std::move(catcher)});
    }